

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

Target * __thiscall
llbuild::buildsystem::BuildDescription::addTarget
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
          *value)

{
  Target *pTVar1;
  StringRef Key;
  __uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  *this_00;
  
  pTVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl;
  Key.Data = (pTVar1->name)._M_dataplus._M_p;
  Key.Length = (pTVar1->name)._M_string_length;
  this_00 = (__uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
             *)llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
               ::operator[](&this->targets,Key);
  std::
  __uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  ::operator=(this_00,(__uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                       *)value);
  return pTVar1;
}

Assistant:

Target& BuildDescription::addTarget(std::unique_ptr<Target> value) {
  auto& result = *value.get();
  getTargets()[value->getName()] = std::move(value);
  return result;
}